

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O3

void If_Dec10MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  word *pwVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  size_t __n;
  byte bVar10;
  byte bVar11;
  word *pwVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  word *pwVar19;
  word pG [16];
  word local_b8 [17];
  
  iVar15 = Var2Pla[v];
  if (p < iVar15) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0xf1,"void If_Dec10MoveTo(word *, int, int, int, int *, int *)");
  }
  if (iVar15 != p) {
    uVar9 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar9 = 1;
    }
    pwVar6 = pF;
    pwVar12 = local_b8;
    bVar7 = false;
    do {
      bVar8 = bVar7;
      pwVar19 = pwVar12;
      pwVar12 = pwVar6;
      if (nVars + -1 <= iVar15) {
        __assert_fail("iVar < nVars - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                      ,0xcc,"void If_Dec10SwapAdjacent(word *, word *, int, int)");
      }
      bVar10 = (byte)iVar15;
      if (iVar15 < 5) {
        if (0 < (int)uVar9) {
          uVar13 = PMasks[iVar15][0];
          uVar3 = PMasks[iVar15][1];
          uVar4 = PMasks[iVar15][2];
          uVar16 = 0;
          do {
            uVar5 = pwVar12[uVar16];
            bVar11 = (byte)(1 << (bVar10 & 0x1f));
            pwVar19[uVar16] =
                 (uVar5 & uVar4) >> (bVar11 & 0x3f) |
                 (uVar5 & uVar3) << (bVar11 & 0x3f) | uVar5 & uVar13;
            uVar16 = uVar16 + 1;
          } while (uVar9 != uVar16);
        }
      }
      else if (iVar15 == 5) {
        if (0 < (int)uVar9) {
          uVar13 = 0;
          do {
            uVar3 = pwVar12[uVar13];
            uVar4 = pwVar12[uVar13 + 1];
            pwVar19[uVar13] = uVar4 << 0x20 | uVar3 & 0xffffffff;
            pwVar19[uVar13 + 1] = uVar3 >> 0x20 | uVar4 & 0xffffffff00000000;
            uVar13 = uVar13 + 2;
          } while (uVar13 < uVar9);
        }
      }
      else if (0 < (int)uVar9) {
        bVar11 = bVar10 - 6;
        __n = (ulong)(uint)(1 << (bVar11 & 0x1f)) * 8;
        lVar14 = 0;
        lVar18 = 0;
        do {
          lVar17 = lVar18 << (bVar10 - 1 & 0x3f);
          lVar1 = (ulong)(uint)(3 << (bVar11 & 0x1f)) * 8 + lVar17;
          lVar2 = (ulong)(uint)(2 << (bVar11 & 0x1f)) * 8 + lVar17;
          memcpy(pwVar19 + lVar14,pwVar12 + lVar14,__n);
          memcpy((void *)(lVar17 + __n + (long)pwVar19),(void *)(lVar2 + (long)pwVar12),__n);
          memcpy((void *)((long)pwVar19 + lVar2),(void *)((long)pwVar12 + lVar17 + __n),__n);
          memcpy((void *)((long)pwVar19 + lVar1),(void *)(lVar1 + (long)pwVar12),__n);
          lVar18 = lVar18 + 1;
          lVar14 = lVar14 + (ulong)(uint)(4 << (bVar11 & 0x1f));
        } while ((int)lVar14 < (int)uVar9);
      }
      Var2Pla[Pla2Var[iVar15]] = Var2Pla[Pla2Var[iVar15]] + 1;
      Var2Pla[Pla2Var[(long)iVar15 + 1]] = Var2Pla[Pla2Var[(long)iVar15 + 1]] + -1;
      *(ulong *)(Pla2Var + iVar15) =
           CONCAT44((int)*(undefined8 *)(Pla2Var + iVar15),
                    (int)((ulong)*(undefined8 *)(Pla2Var + iVar15) >> 0x20));
      iVar15 = Var2Pla[v];
      pwVar6 = pwVar19;
      bVar7 = (bool)(bVar8 ^ 1);
    } while (iVar15 != p);
    if (!bVar8) {
      uVar9 = 1 << ((char)nVars - 6U & 0x1f);
      if (nVars < 7) {
        uVar9 = 1;
      }
      if (0 < (int)uVar9) {
        uVar13 = 0;
        do {
          pF[uVar13] = pwVar19[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
    }
  }
  if (Pla2Var[(uint)p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x101,"void If_Dec10MoveTo(word *, int, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec10MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec10SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec10Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}